

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateVertexIdAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  bool bVar1;
  spv_result_t sVar2;
  DiagnosticStream local_1f0;
  
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  sVar2 = SPV_SUCCESS;
  if (bVar1) {
    ValidationState_t::diag(&local_1f0,this->_,SPV_ERROR_INVALID_DATA,(Instruction *)decoration);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,"Vulkan spec doesn\'t allow BuiltIn VertexId to be used.",0x36)
    ;
    DiagnosticStream::~DiagnosticStream(&local_1f0);
    sVar2 = local_1f0.error_;
  }
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateVertexIdAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  (void)decoration;
  if (spvIsVulkanEnv(_.context()->target_env)) {
    return _.diag(SPV_ERROR_INVALID_DATA, &inst)
           << "Vulkan spec doesn't allow BuiltIn VertexId "
              "to be used.";
  }

  return SPV_SUCCESS;
}